

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O2

bool __thiscall
sf::priv::ImageLoader::loadImageFromFile
          (ImageLoader *this,string *filename,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  pointer puVar1;
  stbi_uc *__src;
  ostream *poVar2;
  int height;
  int width;
  int channels;
  
  puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  width = 0;
  height = 0;
  channels = 0;
  __src = stbi_load((filename->_M_dataplus)._M_p,&width,&height,&channels,4);
  if (__src == (stbi_uc *)0x0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to load image \"");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    poVar2 = std::operator<<(poVar2,"\". Reason: ");
    poVar2 = std::operator<<(poVar2,stbi__g_failure_reason);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    size->x = width;
    size->y = height;
    if (height != 0 && width != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (pixels,(long)(width * height * 4));
      puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      memcpy(puVar1,__src,
             (long)(pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    }
    free(__src);
  }
  return __src != (stbi_uc *)0x0;
}

Assistant:

bool ImageLoader::loadImageFromFile(const std::string& filename, std::vector<Uint8>& pixels, Vector2u& size)
{
    // Clear the array (just in case)
    pixels.clear();

    // Load the image and get a pointer to the pixels in memory
    int width = 0;
    int height = 0;
    int channels = 0;
    unsigned char* ptr = stbi_load(filename.c_str(), &width, &height, &channels, STBI_rgb_alpha);

    if (ptr)
    {
        // Assign the image properties
        size.x = width;
        size.y = height;

        if (width && height)
        {
            // Copy the loaded pixels to the pixel buffer
            pixels.resize(width * height * 4);
            memcpy(&pixels[0], ptr, pixels.size());
        }

        // Free the loaded pixels (they are now in our own pixel buffer)
        stbi_image_free(ptr);

        return true;
    }
    else
    {
        // Error, failed to load the image
        err() << "Failed to load image \"" << filename << "\". Reason: " << stbi_failure_reason() << std::endl;

        return false;
    }
}